

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O0

void GetCodeCmdCallEpilogue
               (CodeGenRegVmContext *ctx,uint *microcode,uchar resultReg,uchar resultType)

{
  uint uVar1;
  uint num;
  uint uVar2;
  x86XmmReg reg1;
  x86Reg xVar3;
  uint *puVar4;
  uint size;
  uint offset;
  uint reg;
  uint tempStackPtrOffset;
  x86XmmReg rTempXmm;
  x86Reg rTempReg;
  x86Reg rTempStack;
  uchar resultType_local;
  uchar resultReg_local;
  uint *microcode_local;
  CodeGenRegVmContext *ctx_local;
  
  EMIT_OP_RPTR_NUM(&ctx->ctx,o_sub64,sQWORD,rR13,0x120,4);
  EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rEBP,sQWORD,rR13,0x158);
  if (resultType == '\x01') {
    reg1 = CodeGenGenericContext::GetXmmReg(&ctx->ctx);
    EMIT_OP_REG_RPTR(&ctx->ctx,o_movsd,reg1,sQWORD,rEBP,0);
    EMIT_OP_RPTR_REG(&ctx->ctx,o_movsd,sQWORD,rEBX,(uint)resultReg << 3,reg1);
  }
  else if (resultType == '\x02') {
    xVar3 = CodeGenGenericContext::GetReg(&ctx->ctx);
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,xVar3,sQWORD,rEBP,0);
    EMIT_OP_RPTR_REG(&ctx->ctx,o_mov64,sQWORD,rEBX,(uint)resultReg << 3,xVar3);
  }
  else if (resultType == '\x03') {
    xVar3 = CodeGenGenericContext::GetReg(&ctx->ctx);
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov,xVar3,sDWORD,rEBP,0);
    EMIT_OP_RPTR_REG(&ctx->ctx,o_mov,sDWORD,rEBX,(uint)resultReg << 3,xVar3);
  }
  offset = 0;
  puVar4 = microcode;
  while (_rTempStack = puVar4, *_rTempStack != 7) {
    puVar4 = _rTempStack + 1;
    uVar1 = *_rTempStack;
    if (uVar1 == 8) {
      xVar3 = CodeGenGenericContext::GetReg(&ctx->ctx);
      EMIT_OP_REG_RPTR(&ctx->ctx,o_mov,xVar3,sDWORD,rEBP,offset);
      EMIT_OP_RPTR_REG(&ctx->ctx,o_mov,sDWORD,rEBX,*puVar4 << 3,xVar3);
      offset = offset + 4;
      puVar4 = _rTempStack + 2;
    }
    else if (uVar1 == 9) {
      xVar3 = CodeGenGenericContext::GetReg(&ctx->ctx);
      EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,xVar3,sQWORD,rEBP,offset);
      EMIT_OP_RPTR_REG(&ctx->ctx,o_mov64,sQWORD,rEBX,*puVar4 << 3,xVar3);
      offset = offset + 8;
      puVar4 = _rTempStack + 2;
    }
    else if (uVar1 == 10) {
      uVar1 = *puVar4;
      num = _rTempStack[2];
      uVar2 = _rTempStack[3];
      EMIT_OP_REG_RPTR(&ctx->ctx,o_lea,rESI,sQWORD,rEBP,offset);
      if (uVar1 == 1) {
        EMIT_OP_REG_REG(&ctx->ctx,o_mov64,rEDI,rR15);
      }
      else if (uVar1 == 2) {
        EMIT_OP_REG_REG(&ctx->ctx,o_mov64,rEDI,rR14);
      }
      else if (uVar1 == 3) {
        EMIT_OP_REG_REG(&ctx->ctx,o_mov64,rEDI,rEBX);
      }
      else {
        EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rEDI,sQWORD,rEBX,uVar1 << 3);
      }
      EMIT_OP_REG_NUM(&ctx->ctx,o_add64,rEDI,num);
      EMIT_OP_REG_NUM(&ctx->ctx,o_mov,rECX,uVar2 >> 2);
      EMIT_OP(&ctx->ctx,o_rep_movsd);
      offset = uVar2 + offset;
      puVar4 = _rTempStack + 4;
    }
  }
  return;
}

Assistant:

void GetCodeCmdCallEpilogue(CodeGenRegVmContext &ctx, unsigned *microcode, unsigned char resultReg, unsigned char resultType)
{
#if defined(_M_X64)
	EMIT_OP_RPTR_NUM(ctx.ctx, o_sub64, sQWORD, rR13, nullcOffsetOf(ctx.vmState, callStackTop), sizeof(CodeGenRegVmCallStackEntry)); // vmState->callStackTop--;

	x86Reg rTempStack = rRBP;

	EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rTempStack, sQWORD, rR13, nullcOffsetOf(ctx.vmState, tempStackArrayBase));

	x86Reg rTempReg = rRegCount;
	x86XmmReg rTempXmm = rXmmRegCount;

	switch(resultType)
	{
	case rvrDouble:
		rTempXmm = ctx.ctx.GetXmmReg();
		EMIT_OP_REG_RPTR(ctx.ctx, o_movsd, rTempXmm, sQWORD, rTempStack, 0);
		EMIT_OP_RPTR_REG(ctx.ctx, o_movsd, sQWORD, rREG, resultReg * 8, rTempXmm);
		break;
	case rvrLong:
		rTempReg = ctx.ctx.GetReg();
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rTempReg, sQWORD, rTempStack, 0);
		EMIT_OP_RPTR_REG(ctx.ctx, o_mov64, sQWORD, rREG, resultReg * 8, rTempReg);
		break;
	case rvrInt:
		rTempReg = ctx.ctx.GetReg();
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rTempReg, sDWORD, rTempStack, 0);
		EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, resultReg * 8, rTempReg);
		break;
	default:
		break;
	}

	unsigned tempStackPtrOffset = 0;

	while(*microcode != rvmiReturn)
	{
		switch(*microcode++)
		{
		case rvmiPop:
			rTempReg = ctx.ctx.GetReg();
			EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rTempReg, sDWORD, rTempStack, tempStackPtrOffset);
			EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, *microcode++ * 8, rTempReg);
			tempStackPtrOffset += sizeof(int);
			break;
		case rvmiPopq:
			rTempReg = ctx.ctx.GetReg();
			EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rTempReg, sQWORD, rTempStack, tempStackPtrOffset);
			EMIT_OP_RPTR_REG(ctx.ctx, o_mov64, sQWORD, rREG, *microcode++ * 8, rTempReg);
			tempStackPtrOffset += sizeof(long long);
			break;
		case rvmiPopMem:
		{
			unsigned reg = *microcode++;
			unsigned offset = *microcode++;
			unsigned size = *microcode++;

			EMIT_OP_REG_RPTR(ctx.ctx, o_lea, rRSI, sQWORD, rTempStack, tempStackPtrOffset);

			if(reg == rvrrFrame)
				EMIT_OP_REG_REG(ctx.ctx, o_mov64, rRDI, rR15);
			else if(reg == rvrrConstants)
				EMIT_OP_REG_REG(ctx.ctx, o_mov64, rRDI, rR14);
			else if(reg == rvrrRegisters)
				EMIT_OP_REG_REG(ctx.ctx, o_mov64, rRDI, rRBX);
			else
				EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRDI, sQWORD, rREG, reg * 8);

			EMIT_OP_REG_NUM(ctx.ctx, o_add64, rRDI, offset);
			EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, size >> 2);
			EMIT_OP(ctx.ctx, o_rep_movsd);

			tempStackPtrOffset += size;
		}
		break;
		}
	}
#else
	//vmState->regFileLastPtr = prevRegFilePtr;
	EMIT_OP_ADDR_REG(ctx.ctx, o_mov, sDWORD, uintptr_t(&ctx.vmState->regFileLastPtr), rEBX);

	// Remove call stack frame
	EMIT_OP_RPTR_NUM(ctx.ctx, o_sub, sDWORD, uintptr_t(&ctx.vmState->callStackTop), sizeof(CodeGenRegVmCallStackEntry)); // vmState->callStackTop--;

	switch(resultType)
	{
	case rvrDouble:
	case rvrLong:
		EMIT_OP_REG_ADDR(ctx.ctx, o_mov, rEAX, sDWORD, uintptr_t(ctx.vmState->tempStackArrayBase));
		EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, resultReg * 8, rEAX);
		EMIT_OP_REG_ADDR(ctx.ctx, o_mov, rEAX, sDWORD, uintptr_t(ctx.vmState->tempStackArrayBase) + 4);
		EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, resultReg * 8 + 4, rEAX);
		break;
	case rvrInt:
		EMIT_OP_REG_ADDR(ctx.ctx, o_mov, rEAX, sDWORD, uintptr_t(ctx.vmState->tempStackArrayBase));
		EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, resultReg * 8, rEAX);
		break;
	default:
		break;
	}

	unsigned tempStackPtrOffset = 0;

	while(*microcode != rvmiReturn)
	{
		switch(*microcode++)
		{
		case rvmiPop:
			EMIT_OP_REG_ADDR(ctx.ctx, o_mov, rEAX, sDWORD, uintptr_t(ctx.vmState->tempStackArrayBase) + tempStackPtrOffset);
			EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, *microcode++ * 8, rEAX);
			tempStackPtrOffset += sizeof(int);
			break;
		case rvmiPopq:
			EMIT_OP_REG_ADDR(ctx.ctx, o_mov, rEAX, sDWORD, uintptr_t(ctx.vmState->tempStackArrayBase) + tempStackPtrOffset);
			EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, *microcode * 8, rEAX);
			EMIT_OP_REG_ADDR(ctx.ctx, o_mov, rEAX, sDWORD, uintptr_t(ctx.vmState->tempStackArrayBase) + tempStackPtrOffset + 4);
			EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, *microcode++ * 8 + 4, rEAX);
			tempStackPtrOffset += sizeof(long long);
			break;
		case rvmiPopMem:
		{
			unsigned reg = *microcode++;
			unsigned offset = *microcode++;
			unsigned size = *microcode++;

			EMIT_OP_REG_REG(ctx.ctx, o_mov, rEDX, rESI); // Save frame register
			EMIT_OP_REG_ADDR(ctx.ctx, o_lea, rESI, sDWORD, uintptr_t(ctx.vmState->tempStackArrayBase) + tempStackPtrOffset);
			EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEDI, sDWORD, rREG, reg * 8);
			EMIT_OP_REG_NUM(ctx.ctx, o_add, rEDI, offset);
			EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, size >> 2);
			EMIT_OP(ctx.ctx, o_rep_movsd);
			EMIT_OP_REG_REG(ctx.ctx, o_mov, rESI, rEDX); // Restore frame register
			EMIT_REG_READ(ctx.ctx, rESI);

			tempStackPtrOffset += size;
		}
		break;
		}
	}
#endif
}